

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

string * read_file(string *__return_storage_ptr__,string *file_name)

{
  char cVar1;
  istream *piVar2;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ifstream infile;
  
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile);
  std::ifstream::open((char *)&infile,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&tmp);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      std::operator+(&local_250,&tmp,anon_var_dwarf_5091 + 0x2b);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_250);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&infile);
  std::__cxx11::string::~string((string *)&tmp);
  return __return_storage_ptr__;
}

Assistant:

std::string read_file(const std::string &file_name) {
    std::string tmp;
    std::string file_content;
    std::ifstream infile;

    infile.open(file_name.c_str(), std::ifstream::binary);

    if (!infile.is_open()) {
        return file_content;
    }

    // 以 '\n' 作为分行标识
    while (getline(infile, tmp))
        file_content += tmp + "\n";

    infile.close();

    return file_content;
}